

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void Fixpp::
     set<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,long>
               (VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                *message,long *value)

{
  type_by_index_t<17UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  *this;
  bool *pbVar1;
  long *value_local;
  VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  *message_local;
  
  this = meta::
         get<17ul,Fixpp::Field<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<115u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<128u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<90u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<91u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<50u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<142u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<57u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<143u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<116u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<144u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<129u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<145u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<43u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<97u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<212u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<213u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<347u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<369u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
                   ((tuple<Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
                     *)message);
  Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>::set<long>(this,value);
  std::bitset<24UL>::set
            (&(message->
              super_MessageT<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
              ).
              super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
              .allBits,0x11,true);
  pbVar1 = identity<bool>(&details::
                           TagIndex<meta::typelist::TypeList<Fixpp::TagT<49U,_Fixpp::Type::String>,_meta::typelist::TypeList<Fixpp::TagT<56U,_Fixpp::Type::String>,_meta::typelist::TypeList<Fixpp::TagT<34U,_Fixpp::Type::Int>,_meta::typelist::TypeList<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>,_meta::typelist::NullType>_>_>_>,_Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>
                           ::Valid);
  if ((*pbVar1 & 1U) != 0) {
    std::bitset<4UL>::set
              (&(message->
                super_MessageT<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                ).
                super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                .requiredBits,3,true);
  }
  return;
}

Assistant:

decltype(auto)
    set(Message& message, Value&& value)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        using RequiredIndex = details::TagIndex<typename Message::RequiredList, Tag>;

        static_assert(Index::Valid, "Invalid tag for given message");
        static_assert(details::IsValidTypeFor<Tag, Value>::value, "Invalid data type for given Tag");

        meta::get<Index::Value>(message.values).set(std::forward<Value>(value));

        message.allBits.set(Index::Value);

        if (identity(RequiredIndex::Valid))
            message.requiredBits.set(static_cast<size_t>(RequiredIndex::Value));
    }